

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::ShaderBitfieldOperationCase::iterate(ShaderBitfieldOperationCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  ShaderBitfieldOperationCase *pSVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  char *__s;
  mapped_type *pmVar8;
  undefined8 uVar9;
  TestError *pTVar10;
  char *pcVar11;
  GLint compileSuccess;
  GLuint data;
  GLint linkSuccess;
  string csString;
  char *strings [1];
  allocator<char> local_f1;
  key_type local_f0;
  undefined4 local_d0;
  undefined4 local_cc;
  long *local_c8 [2];
  long local_b8 [2];
  ShaderBitfieldOperationCase *local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x6c8))(1,&local_cc);
  (**(code **)(lVar7 + 0x40))(0x90d2,local_cc);
  (**(code **)(lVar7 + 0x150))(0x90d2,0xd0,&this->m_data);
  (**(code **)(lVar7 + 0x48))(0x90d2,0,local_cc);
  uVar5 = (**(code **)(lVar7 + 0x3f0))(0x91b9);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "${VERSION_DECL}\n\nlayout(local_size_x = 1) in;\n\nlayout(binding = 0, std430) buffer Data {\n    uvec4 inUvec4;\n    ivec4 inIvec4;\n    vec4 inVec4;\n\n    uvec4 in2Uvec4;\n    ivec4 in2Ivec4;\n    vec4 in2Vec4;\n\n    int offset;\n    int bits;\n\n    uvec4 outUvec4;\n    ivec4 outIvec4;\n    vec4 outVec4;\n\n    uvec4 out2Uvec4;\n    ivec4 out2Ivec4;\n    vec4 out2Vec4;\n};\n\nvoid main()\n{\n    ${TEST_STATEMENT};\n}\n"
             ,"");
  pcVar11 = (this->m_testStatement)._M_dataplus._M_p;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = uVar5;
  local_a8 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  paVar1 = &local_f0.field_2;
  local_f0.field_2._M_allocated_capacity._0_6_ = 0x4f4953524556;
  local_f0.field_2._M_allocated_capacity._6_2_ = 0x5f4e;
  local_f0.field_2._8_4_ = 0x4c434544;
  local_f0._M_string_length = 0xc;
  local_f0.field_2._M_local_buf[0xc] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_f0);
  pcVar2 = (char *)pmVar8->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT26(local_f0.field_2._M_allocated_capacity._6_2_,
                             local_f0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  local_f0.field_2._M_allocated_capacity._0_6_ = 0x535f54534554;
  local_f0.field_2._M_allocated_capacity._6_2_ = 0x4154;
  local_f0.field_2._8_4_ = 0x454d4554;
  local_f0.field_2._M_local_buf[0xc] = 'N';
  local_f0.field_2._M_local_buf[0xd] = 'T';
  local_f0._M_string_length = 0xe;
  local_f0.field_2._M_local_buf[0xe] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_f0);
  pcVar2 = (char *)pmVar8->_M_string_length;
  strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar2,(ulong)pcVar11);
  uVar5 = local_d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT26(local_f0.field_2._M_allocated_capacity._6_2_,
                             local_f0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,(char *)local_c8[0],&local_f1);
  pSVar3 = local_a8;
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_f0,&local_a0);
  tcu::StringTemplate::specialize
            (&local_80,(StringTemplate *)&local_f0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p) !=
      &local_a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p),
                    local_a0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  local_60._M_impl._0_8_ = local_80._M_dataplus._M_p;
  (**(code **)(lVar7 + 0x12b8))(uVar5,1,&local_60,0);
  (**(code **)(lVar7 + 0x248))(uVar5);
  local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
  (**(code **)(lVar7 + 0xa70))(uVar5,0x8b81);
  if ((int)local_f0._M_dataplus._M_p != 0) {
    uVar6 = (**(code **)(lVar7 + 0x3c8))();
    (**(code **)(lVar7 + 0x10))(uVar6,uVar5);
    (**(code **)(lVar7 + 0xce8))(uVar6);
    local_a0._M_dataplus._M_p._0_4_ = 0;
    (**(code **)(lVar7 + 0x9d8))(uVar6,0x8b82);
    if ((int)local_a0._M_dataplus._M_p != 0) {
      (**(code **)(lVar7 + 0x1680))(uVar6);
      (**(code **)(lVar7 + 0x528))(1,1,1);
      uVar9 = (**(code **)(lVar7 + 0xd00))(0x90d2,0,0xd0,1);
      iVar4 = (*(pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (pSVar3,uVar9);
      (**(code **)(lVar7 + 0x1670))(0x90d2);
      (**(code **)(lVar7 + 0x1680))(0);
      (**(code **)(lVar7 + 0x448))(uVar6);
      (**(code **)(lVar7 + 0x470))(uVar5);
      (**(code **)(lVar7 + 0x438))(1,&local_cc);
      pcVar11 = "Fail";
      if ((byte)iVar4 != 0) {
        pcVar11 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((pSVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)((byte)iVar4 ^ 1),pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      return STOP;
    }
    (**(code **)(lVar7 + 0x470))(uVar5);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Link failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
               ,0xd4);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
             ,0xc9);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderBitfieldOperationCase::IterateResult ShaderBitfieldOperationCase::iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	GLuint data;
	gl.genBuffers(1, &data);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, data);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Data), &m_data, GL_STATIC_DRAW);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, data);

	char const* css = "${VERSION_DECL}\n"
					  "\n"
					  "layout(local_size_x = 1) in;\n"
					  "\n"
					  "layout(binding = 0, std430) buffer Data {\n"
					  "    uvec4 inUvec4;\n"
					  "    ivec4 inIvec4;\n"
					  "    vec4 inVec4;\n"
					  "\n"
					  "    uvec4 in2Uvec4;\n"
					  "    ivec4 in2Ivec4;\n"
					  "    vec4 in2Vec4;\n"
					  "\n"
					  "    int offset;\n"
					  "    int bits;\n"
					  "\n"
					  "    uvec4 outUvec4;\n"
					  "    ivec4 outIvec4;\n"
					  "    vec4 outVec4;\n"
					  "\n"
					  "    uvec4 out2Uvec4;\n"
					  "    ivec4 out2Ivec4;\n"
					  "    vec4 out2Vec4;\n"
					  "};\n"
					  "\n"
					  "void main()\n"
					  "{\n"
					  "    ${TEST_STATEMENT};\n"
					  "}\n";

	GLuint		cs		   = gl.createShader(GL_COMPUTE_SHADER);
	std::string csString   = specializeVersion(css, m_glslVersion, m_testStatement.c_str());
	char const* strings[1] = { csString.c_str() };
	gl.shaderSource(cs, 1, strings, 0);
	gl.compileShader(cs);
	GLint compileSuccess = 0;
	gl.getShaderiv(cs, GL_COMPILE_STATUS, &compileSuccess);
	if (!compileSuccess)
	{
		TCU_FAIL("Compile failed");
	}

	GLuint pgm = gl.createProgram();
	gl.attachShader(pgm, cs);
	gl.linkProgram(pgm);
	GLint linkSuccess = 0;
	gl.getProgramiv(pgm, GL_LINK_STATUS, &linkSuccess);
	if (!linkSuccess)
	{
		gl.deleteShader(cs);
		TCU_FAIL("Link failed");
	}

	gl.useProgram(pgm);

	gl.dispatchCompute(1, 1, 1);

	Data const* results = (Data const*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Data), GL_MAP_READ_BIT);
	isOk				= test(results);
	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

	gl.useProgram(0);
	gl.deleteProgram(pgm);
	gl.deleteShader(cs);

	gl.deleteBuffers(1, &data);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}